

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

mg_connection * mg_if_accept_tcp_cb(mg_connection *lc,socket_address *sa,size_t sa_len)

{
  undefined8 uVar1;
  mg_add_sock_opts opts_00;
  mg_connection *c;
  mg_add_sock_opts opts;
  
  opts_00.error_string = (char **)0x0;
  opts_00.user_data = (void *)0x0;
  opts_00.flags = 0;
  opts_00._12_4_ = 0;
  c = mg_create_connection(lc->mgr,lc->handler,opts_00);
  if (c == (mg_connection *)0x0) {
    c = (mg_connection *)0x0;
  }
  else {
    c->listener = lc;
    c->proto_data = lc->proto_data;
    c->proto_handler = lc->proto_handler;
    c->user_data = lc->user_data;
    c->recv_mbuf_limit = lc->recv_mbuf_limit;
    uVar1 = *(undefined8 *)((sa->sa).sa_data + 6);
    *(undefined8 *)&c->sa = *(undefined8 *)sa;
    *(undefined8 *)((long)&c->sa + 8) = uVar1;
    mg_add_conn(c->mgr,c);
    if (lc->ssl_ctx == (SSL_CTX *)0x0) {
      mg_call(c,(mg_event_handler_t)0x0,1,&c->sa);
    }
    if (LL_DEBUG < s_cs_log_level) {
      mg_if_accept_tcp_cb_cold_1();
    }
  }
  return c;
}

Assistant:

struct mg_connection *mg_if_accept_tcp_cb(struct mg_connection *lc,
                                          union socket_address *sa,
                                          size_t sa_len) {
    struct mg_add_sock_opts opts;
    struct mg_connection *nc;
    (void) sa_len;
    memset(&opts, 0, sizeof(opts));
    nc = mg_create_connection(lc->mgr, lc->handler, opts);
    if (nc == NULL) return NULL;
    nc->listener = lc;
    nc->proto_data = lc->proto_data;
    nc->proto_handler = lc->proto_handler;
    nc->user_data = lc->user_data;
    nc->recv_mbuf_limit = lc->recv_mbuf_limit;
    nc->sa = *sa;
    mg_add_conn(nc->mgr, nc);
    if (lc->ssl_ctx == NULL) {
        /* For non-SSL connections deliver MG_EV_ACCEPT right away. */
        mg_call(nc, NULL, MG_EV_ACCEPT, &nc->sa);
    }
    DBG(("%p %p %d %d, %p %p", lc, nc, nc->sock, (int) nc->flags, lc->ssl_ctx,
            nc->ssl));
    return nc;
}